

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dots.h
# Opt level: O3

void __thiscall bandit::reporter::dots::it_unknown_error(dots *this,string *desc)

{
  ostream *poVar1;
  long *local_58;
  long local_50;
  long local_48 [2];
  long *local_38;
  long local_30;
  long local_28 [2];
  
  progress_base::it_unknown_error((progress_base *)this,desc);
  poVar1 = (this->super_colored_base).stm_;
  (*((this->super_colored_base).colorizer_)->_vptr_interface[5])(&local_38);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>(poVar1,(char *)local_38,local_30);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"E",1);
  (*((this->super_colored_base).colorizer_)->_vptr_interface[7])(&local_58);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,(char *)local_58,local_50);
  if (local_58 != local_48) {
    operator_delete(local_58,local_48[0] + 1);
  }
  if (local_38 != local_28) {
    operator_delete(local_38,local_28[0] + 1);
  }
  std::ostream::flush();
  return;
}

Assistant:

void it_unknown_error(const std::string& desc) override {
        progress_base::it_unknown_error(desc);
        stm_ << colorizer_.bad() << "E" << colorizer_.reset();
        stm_.flush();
      }